

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Directory.cpp
# Opt level: O2

bool __thiscall Directory::refresh(Directory *this)

{
  int iVar1;
  DIR *__dirp;
  dirent *pdVar2;
  MutexLocker lock;
  string fullPath;
  string name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  stat entryStatus;
  
  MutexLocker::MutexLocker(&lock,this->dirMutex);
  this->valid = false;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&this->subDirs);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&this->files);
  __dirp = opendir((this->path)._M_dataplus._M_p);
  if (__dirp == (DIR *)0x0) {
    softHSMLog(7,"refresh",
               "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/Directory.cpp"
               ,0x6f,"Failed to open directory %s",(this->path)._M_dataplus._M_p);
  }
  else {
    while (pdVar2 = readdir(__dirp), pdVar2 != (dirent *)0x0) {
      if ((pdVar2->d_name[0] != '.') ||
         ((pdVar2->d_name[1] != '\0' && ((pdVar2->d_name[1] != '.' || (pdVar2->d_name[2] != '\0'))))
         )) {
        std::__cxx11::string::string((string *)&name,pdVar2->d_name,(allocator *)&entryStatus);
        std::operator+(&local_e0,&this->path,"/");
        std::operator+(&fullPath,&local_e0,&name);
        std::__cxx11::string::~string((string *)&local_e0);
        iVar1 = lstat(fullPath._M_dataplus._M_p,(stat *)&entryStatus);
        if (iVar1 == 0) {
          if ((entryStatus.st_mode & 0xf000) == 0x4000) {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(&this->subDirs,&name);
          }
          else {
            softHSMLog(7,"refresh",
                       "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/Directory.cpp"
                       ,0xa8,"File not used %s",name._M_dataplus._M_p);
          }
        }
        std::__cxx11::string::~string((string *)&fullPath);
        std::__cxx11::string::~string((string *)&name);
      }
    }
    closedir(__dirp);
    this->valid = true;
  }
  MutexLocker::~MutexLocker(&lock);
  return __dirp != (DIR *)0x0;
}

Assistant:

bool Directory::refresh()
{
	// Prevent concurrent call until valid is reset
	MutexLocker lock(dirMutex);

	// Reset the state
	valid = false;

	subDirs.clear();
	files.clear();

#ifndef _WIN32
	// Enumerate the directory
	DIR* dir = opendir(path.c_str());

	if (dir == NULL)
	{
		DEBUG_MSG("Failed to open directory %s", path.c_str());

		return false;
	}

	// Enumerate the directory
	struct dirent* entry = NULL;

	while ((entry = readdir(dir)) != NULL)
	{
		bool pushed = false;

		// Check if this is the . or .. entry
		if (!strcmp(entry->d_name, ".") || !strcmp(entry->d_name, ".."))
		{
			continue;
		}

		// Convert the name of the entry to a C++ string
		std::string name(entry->d_name);

#if defined(_DIRENT_HAVE_D_TYPE) && defined(_BSD_SOURCE)
		// Determine the type of the entry
		switch(entry->d_type)
		{
		case DT_DIR:
			// This is a directory
			subDirs.push_back(name);
			pushed = true;
			break;
		case DT_REG:
			// This is a regular file
			files.push_back(name);
			pushed = true;
			break;
		default:
			break;
		}
#endif
		if (!pushed) {
			// The entry type has to be determined using lstat
			struct stat entryStatus;

			std::string fullPath = path + OS_PATHSEP + name;

			if (!lstat(fullPath.c_str(), &entryStatus))
			{
				if (S_ISDIR(entryStatus.st_mode))
				{
					subDirs.push_back(name);
				}
				else if (S_ISREG(entryStatus.st_mode))
				{
					files.push_back(name);
				}
				else
				{
					DEBUG_MSG("File not used %s", name.c_str());
				}
			}
		}
	}

	// Close the directory
	closedir(dir);

#else
	// Enumerate the directory
	std::string pattern;
	intptr_t h;
	struct _finddata_t fi;

	if ((path.back() == '/') || (path.back() == '\\'))
		pattern = path + "*";
	else
		pattern = path + "/*";
	memset(&fi, 0, sizeof(fi));
	h = _findfirst(pattern.c_str(), &fi);
	if (h == -1)
	{
		// empty directory
		if (errno == ENOENT)
			goto finished;

		DEBUG_MSG("Failed to open directory %s", path.c_str());

		return false;
	}

	// scan files & subdirs
	do {
		// Check if this is the . or .. entry
		if (!strcmp(fi.name, ".") || !strcmp(fi.name, ".."))
			continue;

		if ((fi.attrib & _A_SUBDIR) == 0)
			files.push_back(fi.name);
		else
			subDirs.push_back(fi.name);

		memset(&fi, 0, sizeof(fi));
	} while (_findnext(h, &fi) == 0);

	(void) _findclose(h);

    finished:
#endif

	valid = true;

	return true;
}